

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combination.c
# Opt level: O3

int generateCombinatorialStabil
              (Aig_Man_t *pAigNew,Aig_Man_t *pAigOld,Vec_Int_t *vCandidateMonotoneSignals_,
              Vec_Ptr_t *vDisj_nCk_,int combN,int combK)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  bool bVar5;
  Vec_Int_t *p;
  int *piVar6;
  ulong uVar7;
  void **ppvVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  Aig_Obj_t *p0;
  int iVar12;
  Aig_Obj_t *p1;
  
  p = (Vec_Int_t *)malloc(0x10);
  iVar12 = 0x10;
  if (0xe < combK + 2U) {
    iVar12 = combK + 3;
  }
  p->nSize = 0;
  p->nCap = iVar12;
  if (iVar12 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar12 << 2);
  }
  p->pArray = piVar6;
  if (-1 < combK) {
    iVar12 = -1;
    do {
      Vec_IntPush(p,iVar12);
      iVar12 = iVar12 + 1;
    } while (combK != iVar12);
  }
  Vec_IntPush(p,combN);
  iVar12 = 0;
  Vec_IntPush(p,0);
  while( true ) {
    p1 = (Aig_Obj_t *)((ulong)pAigNew->pConst1 ^ 1);
    if (0 < combK) {
      iVar1 = p->nSize;
      uVar11 = combK;
      do {
        if (iVar1 <= combK) goto LAB_00598513;
        iVar2 = p->pArray[uVar11];
        if (((long)iVar2 < 0) || (vCandidateMonotoneSignals_->nSize <= iVar2)) goto LAB_00598513;
        iVar2 = vCandidateMonotoneSignals_->pArray[iVar2];
        if (((long)iVar2 < 0) || (pAigOld->vCos->nSize <= iVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar3 = pAigOld->vCos->pArray[iVar2];
        if (((ulong)pvVar3 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar4 = *(ulong *)((long)pvVar3 + 8);
        uVar7 = uVar4 & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          p0 = (Aig_Obj_t *)0x0;
        }
        else {
          p0 = (Aig_Obj_t *)((ulong)((uint)uVar4 & 1) ^ *(ulong *)(uVar7 + 0x28));
        }
        p1 = Aig_Or(pAigNew,p0,p1);
        bVar5 = 1 < (int)uVar11;
        uVar11 = uVar11 - 1;
      } while (bVar5);
    }
    uVar11 = vDisj_nCk_->nSize;
    if (uVar11 == vDisj_nCk_->nCap) {
      if ((int)uVar11 < 0x10) {
        if (vDisj_nCk_->pArray == (void **)0x0) {
          ppvVar8 = (void **)malloc(0x80);
        }
        else {
          ppvVar8 = (void **)realloc(vDisj_nCk_->pArray,0x80);
        }
        vDisj_nCk_->pArray = ppvVar8;
        vDisj_nCk_->nCap = 0x10;
      }
      else {
        if (vDisj_nCk_->pArray == (void **)0x0) {
          ppvVar8 = (void **)malloc((ulong)uVar11 << 4);
        }
        else {
          ppvVar8 = (void **)realloc(vDisj_nCk_->pArray,(ulong)uVar11 << 4);
        }
        vDisj_nCk_->pArray = ppvVar8;
        vDisj_nCk_->nCap = uVar11 * 2;
      }
    }
    else {
      ppvVar8 = vDisj_nCk_->pArray;
    }
    iVar12 = iVar12 + 1;
    iVar1 = vDisj_nCk_->nSize;
    vDisj_nCk_->nSize = iVar1 + 1;
    ppvVar8[iVar1] = p1;
    lVar9 = (long)p->nSize;
    if ((lVar9 < 2) || (lVar9 == 2)) break;
    piVar6 = p->pArray;
    lVar10 = 0;
    while( true ) {
      if (piVar6[lVar10 + 1] + 1 != piVar6[lVar10 + 2]) break;
      piVar6[lVar10 + 1] = (int)lVar10;
      lVar10 = lVar10 + 1;
      if (lVar9 + -2 == lVar10) goto LAB_00598513;
    }
    if (combK < (int)lVar10 + 1) {
      free(piVar6);
      free(p);
      return iVar12;
    }
    piVar6[lVar10 + 1] = piVar6[lVar10 + 1] + 1;
  }
LAB_00598513:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int generateCombinatorialStabil( Aig_Man_t *pAigNew, Aig_Man_t *pAigOld, 
				Vec_Int_t *vCandidateMonotoneSignals_,
				Vec_Ptr_t *vDisj_nCk_,
				int combN, int combK )
{
	Aig_Obj_t *pObjMonoCand, *pObj;
	int targetPoIndex;

	//Knuth's Data Strcuture
	int totalCombination_KNUTH = 0;
	Vec_Int_t *vC_KNUTH;
	int i_KNUTH, j_KNUTH;

	//Knuth's Data Structure Initialization
	vC_KNUTH = Vec_IntAlloc(combK+3);
	for(i_KNUTH=-1; i_KNUTH<combK; i_KNUTH++)
		Vec_IntPush( vC_KNUTH, i_KNUTH );
	Vec_IntPush( vC_KNUTH, combN );
	Vec_IntPush( vC_KNUTH, 0 );

	while(1)
	{
		totalCombination_KNUTH++;
		pObjMonoCand = Aig_Not(Aig_ManConst1(pAigNew));
		for( i_KNUTH=combK; i_KNUTH>0; i_KNUTH--)
		{
			targetPoIndex = Vec_IntEntry( vCandidateMonotoneSignals_, Vec_IntEntry(vC_KNUTH, i_KNUTH));
			pObj = Aig_ObjChild0Copy(Aig_ManCo( pAigOld, targetPoIndex ));
			pObjMonoCand = Aig_Or( pAigNew, pObj, pObjMonoCand );
		}
		Vec_PtrPush(vDisj_nCk_, pObjMonoCand );

		j_KNUTH = 1;
		while( Vec_IntEntry( vC_KNUTH, j_KNUTH ) + 1 == Vec_IntEntry( vC_KNUTH, j_KNUTH+1 ) )
		{
			Vec_IntWriteEntry( vC_KNUTH, j_KNUTH, j_KNUTH-1 );
			j_KNUTH = j_KNUTH + 1;
		}
		if( j_KNUTH > combK ) break;
		Vec_IntWriteEntry( vC_KNUTH, j_KNUTH, Vec_IntEntry( vC_KNUTH, j_KNUTH ) + 1 );
	}

	Vec_IntFree(vC_KNUTH);

	return totalCombination_KNUTH;
}